

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O1

void ncnn::conv3x3s1_winograd23_transform_kernel_sse
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  void *pvVar11;
  size_t sVar12;
  undefined1 auVar13 [32];
  ulong uVar14;
  int iVar15;
  undefined1 (*pauVar16) [16];
  long lVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  float tmp [4] [3];
  float afStack_70 [2];
  undefined1 local_68 [32];
  undefined1 local_48 [16];
  
  afStack_70[0] = 2.385014e-39;
  afStack_70[1] = 0.0;
  Mat::create(kernel_tm,0x10,inch,outch,4,(Allocator *)0x0);
  auVar13 = _DAT_00319be0;
  if (0 < outch) {
    pvVar11 = kernel->data;
    iVar10 = kernel_tm->w;
    uVar14 = 0;
    do {
      if (0 < inch) {
        iVar15 = inch * 9 * (int)uVar14;
        sVar12 = kernel_tm->elemsize;
        pauVar16 = (undefined1 (*) [16])(kernel_tm->cstep * sVar12 * uVar14 + (long)kernel_tm->data)
        ;
        uVar19 = 0;
        do {
          fVar1 = *(float *)((long)pvVar11 + uVar19 * 0x24 + (long)iVar15 * 4);
          fVar2 = *(float *)((long)pvVar11 + uVar19 * 0x24 + (long)iVar15 * 4 + 4);
          fVar3 = *(float *)((long)pvVar11 + uVar19 * 0x24 + (long)iVar15 * 4 + 8);
          fVar4 = *(float *)((long)pvVar11 + uVar19 * 0x24 + (long)iVar15 * 4 + 0xc);
          fVar5 = *(float *)((long)pvVar11 + uVar19 * 0x24 + (long)iVar15 * 4 + 0x10);
          fVar6 = *(float *)((long)pvVar11 + uVar19 * 0x24 + (long)iVar15 * 4 + 0x14);
          fVar7 = *(float *)((long)pvVar11 + uVar19 * 0x24 + (long)iVar15 * 4 + 0x18);
          fVar8 = *(float *)((long)pvVar11 + uVar19 * 0x24 + (long)iVar15 * 4 + 0x1c);
          fVar9 = *(float *)((long)pvVar11 + uVar19 * 0x24 + (long)iVar15 * 4 + 0x20);
          auVar20._0_4_ = fVar2 * 0.0 + fVar1 * 1.0 + fVar3 * 0.0;
          auVar20._4_4_ = fVar2 * 0.5 + fVar1 * 0.5 + fVar3 * 0.5;
          auVar20._8_4_ = fVar2 * -0.5 + fVar1 * 0.5 + fVar3 * 0.5;
          auVar20._12_4_ = fVar2 * 0.0 + fVar1 * 0.0 + fVar3 * 1.0;
          auVar22._0_4_ = fVar5 * 0.0 + fVar4 * 1.0 + fVar6 * 0.0;
          auVar22._4_4_ = fVar5 * 0.5 + fVar4 * 0.5 + fVar6 * 0.5;
          auVar22._8_4_ = fVar5 * -0.5 + fVar4 * 0.5 + fVar6 * 0.5;
          auVar22._12_4_ = fVar5 * 0.0 + fVar4 * 0.0 + fVar6 * 1.0;
          auVar23._0_8_ =
               CONCAT44(fVar8 * 0.5 + fVar7 * 0.5 + fVar9 * 0.5,
                        fVar8 * 0.0 + fVar7 * 1.0 + fVar9 * 0.0);
          auVar23._8_4_ = fVar8 * -0.5 + fVar7 * 0.5 + fVar9 * 0.5;
          auVar23._12_4_ = fVar8 * 0.0 + fVar7 * 0.0 + fVar9 * 1.0;
          auVar24._16_16_ = auVar22;
          auVar24._0_16_ = auVar20;
          auVar26 = vpermilps_avx(auVar24,auVar13);
          auVar25._16_16_ = auVar20;
          auVar25._0_16_ = auVar22;
          auVar24 = vmovsldup_avx(auVar25);
          auVar24 = vblendps_avx(auVar26,auVar24,0x42);
          auVar26._8_8_ = auVar23._0_8_;
          auVar26._0_8_ = auVar23._0_8_;
          auVar26._16_16_ = auVar23;
          local_68 = vblendps_avx(auVar24,auVar26,0x24);
          auVar22 = vshufps_avx(auVar20,auVar22,0xff);
          auVar20 = vshufpd_avx(auVar23,auVar23,3);
          local_48 = vblendps_avx(auVar20,auVar22,6);
          lVar17 = 8;
          pauVar18 = pauVar16;
          do {
            fVar1 = *(float *)(local_68 + lVar17 + -8);
            fVar2 = *(float *)(local_68 + lVar17 + -4);
            fVar3 = *(float *)(local_68 + lVar17);
            auVar21._0_4_ = fVar2 * 0.0 + fVar1 * 1.0 + fVar3 * 0.0;
            auVar21._4_4_ = fVar2 * 0.5 + fVar1 * 0.5 + fVar3 * 0.5;
            auVar21._8_4_ = fVar2 * -0.5 + fVar1 * 0.5 + fVar3 * 0.5;
            auVar21._12_4_ = fVar2 * 0.0 + fVar1 * 0.0 + fVar3 * 1.0;
            *pauVar18 = auVar21;
            pauVar18 = pauVar18 + 1;
            lVar17 = lVar17 + 0xc;
          } while (lVar17 != 0x38);
          uVar19 = uVar19 + 1;
          pauVar16 = (undefined1 (*) [16])((long)*pauVar16 + sVar12 * (long)iVar10);
        } while (uVar19 != (uint)inch);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != (uint)outch);
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel_sse(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    kernel_tm.create(4 * 4, inch, outch);

    // G
    const float ktm[4][3] = {
        {1.0f, 0.0f, 0.0f},
        {1.0f / 2, 1.0f / 2, 1.0f / 2},
        {1.0f / 2, -1.0f / 2, 1.0f / 2},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[4][3];
            for (int i = 0; i < 4; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 4; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 4; i++)
                {
                    kernel_tm0[j * 4 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }
}